

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomBasisCurves>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               GeomBasisCurves *curves,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *this;
  uint uVar1;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *pTVar2;
  string *psVar3;
  bool bVar4;
  bool bVar5;
  __type _Var6;
  ostream *poVar7;
  size_type sVar8;
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var9;
  char *pcVar10;
  TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis> *pTVar11;
  Property *pPVar12;
  _Rb_tree_node_base *__lhs;
  int iVar13;
  undefined8 in_stack_fffffffffffffc18;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *target;
  allocator local_3d9;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *local_3d8;
  _Rb_tree_node_base *local_3d0;
  string *local_3c8;
  ParseResult ret;
  string local_390;
  TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis> *local_370;
  TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis> *local_368;
  TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Type> *local_360;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  ostringstream ss_e;
  code *local_2b8 [45];
  _Any_data local_150;
  code *local_140;
  function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_130;
  function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_110;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  target = (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
           CONCAT44((int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                    (uint)options->strict_allowedToken_check);
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar4 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,&table,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&curves->super_GPrim,warn,err,options->strict_allowedToken_check)
  ;
  if (bVar4) {
    p_Var9 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_370 = (TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis> *)&curves->wrap;
    local_368 = &curves->basis;
    local_360 = &curves->type;
    local_3d8 = (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                err;
    local_3c8 = warn;
    while( true ) {
      pPVar12 = (Property *)&ss_e;
      bVar4 = (_Rb_tree_header *)p_Var9 == &(properties->_M_t)._M_impl.super__Rb_tree_header;
      if (bVar4) break;
      __lhs = p_Var9 + 1;
      ::std::__cxx11::string::string(local_50,(string *)__lhs);
      this = (Property *)(p_Var9 + 2);
      ::std::__cxx11::string::string((string *)pPVar12,"curveVertexCounts",(allocator *)&local_390);
      (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                (&ret,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50,(string *)this,pPVar12,(string *)&curves->curveVertexCounts,target);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar13 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar5 = false;
        iVar13 = 3;
      }
      else {
        bVar5 = true;
        if (ret.code != Unmatched) {
          local_3d0 = __lhs;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar7 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc35);
          ::std::operator<<(poVar7," ");
          ::std::__cxx11::string::string
                    ((string *)&local_2e8,"Parsing attribute `{}` failed. Error: {}",&local_3d9);
          fmt::format<char[18],std::__cxx11::string>
                    (&local_390,(fmt *)&local_2e8,(string *)"curveVertexCounts",
                     (char (*) [18])&ret.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar12);
          poVar7 = ::std::operator<<((ostream *)&ss_e,(string *)&local_390);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          pTVar2 = local_3d8;
          if (local_3d8 !=
              (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)0x0)
          {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+(&local_390,&local_2e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pTVar2);
            ::std::__cxx11::string::operator=((string *)pTVar2,(string *)&local_390);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar5 = false;
          iVar13 = 1;
          __lhs = local_3d0;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar5) {
        ::std::__cxx11::string::string(local_70,(string *)__lhs);
        pPVar12 = (Property *)&ss_e;
        ::std::__cxx11::string::string((string *)pPVar12,"points",(allocator *)&local_390);
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,(string *)this,pPVar12,(string *)&curves->points,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                    *)target);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar13 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar5 = false;
          iVar13 = 3;
        }
        else {
          bVar5 = true;
          if (ret.code != Unmatched) {
            local_3d0 = __lhs;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar7 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc36);
            ::std::operator<<(poVar7," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2e8,"Parsing attribute `{}` failed. Error: {}",&local_3d9);
            fmt::format<char[7],std::__cxx11::string>
                      (&local_390,(fmt *)&local_2e8,(string *)"points",(char (*) [7])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar12)
            ;
            poVar7 = ::std::operator<<((ostream *)&ss_e,(string *)&local_390);
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            pTVar2 = local_3d8;
            if (local_3d8 !=
                (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_390,&local_2e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pTVar2);
              ::std::__cxx11::string::operator=((string *)pTVar2,(string *)&local_390);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar5 = false;
            iVar13 = 1;
            __lhs = local_3d0;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar5) goto LAB_001b20e7;
        ::std::__cxx11::string::string(local_90,(string *)__lhs);
        pPVar12 = (Property *)&ss_e;
        ::std::__cxx11::string::string((string *)pPVar12,"velocities",(allocator *)&local_390);
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_90,(string *)this,pPVar12,(string *)&curves->velocities,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                    *)target);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar13 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar5 = false;
          iVar13 = 3;
        }
        else {
          bVar5 = true;
          if (ret.code != Unmatched) {
            local_3d0 = __lhs;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar7 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc38);
            ::std::operator<<(poVar7," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2e8,"Parsing attribute `{}` failed. Error: {}",&local_3d9);
            fmt::format<char[11],std::__cxx11::string>
                      (&local_390,(fmt *)&local_2e8,(string *)"velocities",(char (*) [11])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar12)
            ;
            poVar7 = ::std::operator<<((ostream *)&ss_e,(string *)&local_390);
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            pTVar2 = local_3d8;
            if (local_3d8 !=
                (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_390,&local_2e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pTVar2);
              ::std::__cxx11::string::operator=((string *)pTVar2,(string *)&local_390);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar5 = false;
            iVar13 = 1;
            __lhs = local_3d0;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar5) goto LAB_001b20e7;
        ::std::__cxx11::string::string(local_b0,(string *)__lhs);
        pPVar12 = (Property *)&ss_e;
        ::std::__cxx11::string::string((string *)pPVar12,"normals",(allocator *)&local_390);
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b0,(string *)this,pPVar12,(string *)&curves->normals,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                    *)target);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar13 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar5 = false;
          iVar13 = 3;
        }
        else {
          bVar5 = true;
          if (ret.code != Unmatched) {
            local_3d0 = __lhs;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar7 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc3a);
            ::std::operator<<(poVar7," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2e8,"Parsing attribute `{}` failed. Error: {}",&local_3d9);
            fmt::format<char[8],std::__cxx11::string>
                      (&local_390,(fmt *)&local_2e8,(string *)0x48b8b9,(char (*) [8])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar12)
            ;
            poVar7 = ::std::operator<<((ostream *)&ss_e,(string *)&local_390);
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            pTVar2 = local_3d8;
            if (local_3d8 !=
                (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_390,&local_2e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pTVar2);
              ::std::__cxx11::string::operator=((string *)pTVar2,(string *)&local_390);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar5 = false;
            iVar13 = 1;
            __lhs = local_3d0;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar5) goto LAB_001b20e7;
        ::std::__cxx11::string::string(local_d0,(string *)__lhs);
        pPVar12 = (Property *)&ss_e;
        ::std::__cxx11::string::string((string *)pPVar12,"accelerations",(allocator *)&local_390);
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d0,(string *)this,pPVar12,(string *)&curves->accelerations,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                    *)target);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar13 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar5 = false;
          iVar13 = 3;
        }
        else {
          bVar5 = true;
          if (ret.code != Unmatched) {
            local_3d0 = __lhs;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar7 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc3c);
            ::std::operator<<(poVar7," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2e8,"Parsing attribute `{}` failed. Error: {}",&local_3d9);
            fmt::format<char[14],std::__cxx11::string>
                      (&local_390,(fmt *)&local_2e8,(string *)"accelerations",
                       (char (*) [14])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar12)
            ;
            poVar7 = ::std::operator<<((ostream *)&ss_e,(string *)&local_390);
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            pTVar2 = local_3d8;
            if (local_3d8 !=
                (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_390,&local_2e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pTVar2);
              ::std::__cxx11::string::operator=((string *)pTVar2,(string *)&local_390);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar5 = false;
            iVar13 = 1;
            __lhs = local_3d0;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar5) goto LAB_001b20e7;
        ::std::__cxx11::string::string(local_f0,(string *)__lhs);
        pPVar12 = (Property *)&ss_e;
        ::std::__cxx11::string::string((string *)pPVar12,"widths",(allocator *)&local_390);
        (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_f0,(string *)this,pPVar12,(string *)&curves->widths,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                    *)target);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar13 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar5 = false;
          iVar13 = 3;
        }
        else {
          bVar5 = true;
          if (ret.code != Unmatched) {
            local_3d0 = __lhs;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar7 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc3d);
            ::std::operator<<(poVar7," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2e8,"Parsing attribute `{}` failed. Error: {}",&local_3d9);
            fmt::format<char[7],std::__cxx11::string>
                      (&local_390,(fmt *)&local_2e8,(string *)"widths",(char (*) [7])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar12)
            ;
            poVar7 = ::std::operator<<((ostream *)&ss_e,(string *)&local_390);
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            pTVar2 = local_3d8;
            if (local_3d8 !=
                (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_390,&local_2e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pTVar2);
              ::std::__cxx11::string::operator=((string *)pTVar2,(string *)&local_390);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar5 = false;
            iVar13 = 1;
            __lhs = local_3d0;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar5) goto LAB_001b20e7;
        bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"type");
        if (bVar5) {
          ::std::__cxx11::string::string((string *)&ss_e,"type",(allocator *)&ret);
          sVar8 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(key_type *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          if (sVar8 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_e,this);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var6 = ::std::operator==((string *)&ss_e,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret);
            if ((_Var6) && (uVar1 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar1 < 2)) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar7 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc3f);
                ::std::operator<<(poVar7," ");
                poVar7 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                poVar7 = ::std::operator<<(poVar7,"type");
                poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
                ::std::operator<<(poVar7,"\n");
                psVar3 = local_3c8;
                if (local_3c8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,&local_390,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_3d8);
                  ::std::__cxx11::string::operator=((string *)psVar3,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                AttrMetas::operator=(&local_360->_metas,(AttrMetas *)(p_Var9 + 7));
                pcVar10 = "type";
LAB_001b1c59:
                ::std::__cxx11::string::string((string *)&ss_e,pcVar10,(allocator *)&ret);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001b20f2;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            _ss_e = (pointer)0x0;
            local_2b8[0] = ::std::
                           _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3095:22)>
                           ::_M_manager;
            ::std::__cxx11::string::string((string *)&ret,"type",(allocator *)&local_390);
            bVar5 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function(&local_110,
                       (function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_e);
            target = local_3d8;
            bVar5 = ParseUniformEnumProperty<tinyusdz::GeomBasisCurves::Type,tinyusdz::GeomBasisCurves::Type>
                              ((string *)&ret,bVar5,&local_110,(Attribute *)this,local_360,local_3c8
                               ,(string *)local_3d8);
            if (local_110.super__Function_base._M_manager != (code *)0x0) {
              (*local_110.super__Function_base._M_manager)(&local_110,&local_110,3);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar13 = 1;
            if (bVar5) {
              AttrMetas::operator=(&local_360->_metas,(AttrMetas *)(p_Var9 + 7));
              pcVar10 = "type";
LAB_001b20a1:
              ::std::__cxx11::string::string((string *)&ret,pcVar10,(allocator *)&local_390);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
              ::std::__cxx11::string::_M_dispose();
              iVar13 = 3;
            }
LAB_001b20c5:
            if (local_2b8[0] != (code *)0x0) {
              (*local_2b8[0])(&ss_e,&ss_e,3);
            }
            goto LAB_001b20e7;
          }
        }
        else {
          bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"basis");
          if (bVar5) {
            ::std::__cxx11::string::string((string *)&ss_e,"basis",(allocator *)&ret);
            sVar8 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            if (sVar8 == 0) {
              Property::value_type_name_abi_cxx11_((string *)&ss_e,this);
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var6 = ::std::operator==((string *)&ss_e,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&ret);
              if ((_Var6) && (uVar1 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar1 < 2)) {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                pcVar10 = "basis";
                if (uVar1 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar7 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                  poVar7 = ::std::operator<<(poVar7,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar7 = ::std::operator<<(poVar7,":");
                  poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
                  poVar7 = ::std::operator<<(poVar7,"():");
                  poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc41);
                  ::std::operator<<(poVar7," ");
                  poVar7 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                  poVar7 = ::std::operator<<(poVar7,"basis");
                  poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
                  ::std::operator<<(poVar7,"\n");
                  psVar3 = local_3c8;
                  if (local_3c8 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret,&local_390,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_3d8);
                    ::std::__cxx11::string::operator=((string *)psVar3,(string *)&ret);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  pTVar11 = local_368;
LAB_001b1c4e:
                  AttrMetas::operator=(&pTVar11->_metas,(AttrMetas *)(p_Var9 + 7));
                  goto LAB_001b1c59;
                }
              }
              else {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              _ss_e = (pointer)0x0;
              local_2b8[0] = ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3083:23)>
                             ::_M_manager;
              ::std::__cxx11::string::string((string *)&ret,"basis",(allocator *)&local_390);
              bVar5 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_130,
                         (function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&ss_e);
              target = local_3d8;
              bVar5 = ParseUniformEnumProperty<tinyusdz::GeomBasisCurves::Basis,tinyusdz::GeomBasisCurves::Basis>
                                ((string *)&ret,bVar5,&local_130,(Attribute *)this,local_368,
                                 local_3c8,(string *)local_3d8);
              if (local_130.super__Function_base._M_manager != (code *)0x0) {
                (*local_130.super__Function_base._M_manager)(&local_130,&local_130,3);
              }
              ::std::__cxx11::string::_M_dispose();
              iVar13 = 1;
              pcVar10 = "basis";
              pTVar11 = local_368;
              if (bVar5) {
LAB_001b2091:
                AttrMetas::operator=(&pTVar11->_metas,(AttrMetas *)(p_Var9 + 7));
                goto LAB_001b20a1;
              }
              goto LAB_001b20c5;
            }
          }
          else {
            bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"wrap");
            if (bVar5) {
              ::std::__cxx11::string::string((string *)&ss_e,"wrap",(allocator *)&ret);
              sVar8 = ::std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&table,(key_type *)&ss_e);
              ::std::__cxx11::string::_M_dispose();
              if (sVar8 == 0) {
                Property::value_type_name_abi_cxx11_((string *)&ss_e,this);
                tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                _Var6 = ::std::operator==((string *)&ss_e,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&ret);
                if ((_Var6) && (uVar1 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar1 < 2)) {
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  pcVar10 = "wrap";
                  if (uVar1 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar7 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                    poVar7 = ::std::operator<<(poVar7,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                              );
                    poVar7 = ::std::operator<<(poVar7,":");
                    poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
                    poVar7 = ::std::operator<<(poVar7,"():");
                    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc43);
                    ::std::operator<<(poVar7," ");
                    poVar7 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                    poVar7 = ::std::operator<<(poVar7,"wrap");
                    poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.")
                    ;
                    ::std::operator<<(poVar7,"\n");
                    psVar3 = local_3c8;
                    if (local_3c8 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&ret,&local_390,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_3d8);
                      ::std::__cxx11::string::operator=((string *)psVar3,(string *)&ret);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                    pTVar11 = local_370;
                    goto LAB_001b1c4e;
                  }
                }
                else {
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                _ss_e = (pointer)0x0;
                local_2b8[0] = ::std::
                               _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3106:22)>
                               ::_M_manager;
                ::std::__cxx11::string::string((string *)&ret,"wrap",(allocator *)&local_390);
                bVar5 = options->strict_allowedToken_check;
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&local_150,
                           (function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&ss_e);
                target = local_3d8;
                bVar5 = ParseUniformEnumProperty<tinyusdz::GeomBasisCurves::Wrap,tinyusdz::GeomBasisCurves::Wrap>
                                  ((string *)&ret,bVar5,
                                   (EnumHandlerFun<tinyusdz::GeomBasisCurves::Wrap> *)&local_150,
                                   (Attribute *)this,
                                   (TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Wrap> *)
                                   local_370,local_3c8,(string *)local_3d8);
                if (local_140 != (code *)0x0) {
                  (*local_140)(&local_150,&local_150,__destroy_functor);
                }
                ::std::__cxx11::string::_M_dispose();
                iVar13 = 1;
                pcVar10 = "wrap";
                pTVar11 = local_370;
                if (bVar5) goto LAB_001b2091;
                goto LAB_001b20c5;
              }
            }
            else {
              sVar8 = ::std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&table,(key_type *)__lhs);
              if (sVar8 == 0) {
                this_00 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          ::operator[](&(curves->super_GPrim).props,(key_type *)__lhs);
                Property::operator=(this_00,this);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __lhs);
              }
              sVar8 = ::std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&table,(key_type *)__lhs);
              if (sVar8 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar7 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xc47);
                ::std::operator<<(poVar7," ");
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__lhs);
                poVar7 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
                ::std::operator<<(poVar7,"\n");
                ::std::__cxx11::string::_M_dispose();
                psVar3 = local_3c8;
                if (local_3c8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,&local_390,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_3d8);
                  ::std::__cxx11::string::operator=((string *)psVar3,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              }
            }
          }
        }
      }
      else {
LAB_001b20e7:
        if ((iVar13 != 3) && (iVar13 != 0)) break;
      }
LAB_001b20f2:
      p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var9);
    }
  }
  else {
    bVar4 = false;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar4;
}

Assistant:

bool ReconstructPrim(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomBasisCurves *curves,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)references;
  (void)options;

  DCOUT("GeomBasisCurves");

  auto BasisHandler = [](const std::string &tok)
      -> nonstd::expected<GeomBasisCurves::Basis, std::string> {
    using EnumTy = std::pair<GeomBasisCurves::Basis, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomBasisCurves::Basis::Bezier, "bezier"),
        std::make_pair(GeomBasisCurves::Basis::Bspline, "bspline"),
        std::make_pair(GeomBasisCurves::Basis::CatmullRom, "catmullRom"),
    };

    return EnumHandler<GeomBasisCurves::Basis>("basis", tok, enums);
  };

  auto TypeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomBasisCurves::Type, std::string> {
    using EnumTy = std::pair<GeomBasisCurves::Type, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomBasisCurves::Type::Cubic, "cubic"),
        std::make_pair(GeomBasisCurves::Type::Linear, "linear"),
    };

    return EnumHandler<GeomBasisCurves::Type>("type", tok, enums);
  };

  auto WrapHandler = [](const std::string &tok)
      -> nonstd::expected<GeomBasisCurves::Wrap, std::string> {
    using EnumTy = std::pair<GeomBasisCurves::Wrap, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomBasisCurves::Wrap::Nonperiodic, "nonperiodic"),
        std::make_pair(GeomBasisCurves::Wrap::Periodic, "periodic"),
        std::make_pair(GeomBasisCurves::Wrap::Pinned, "periodic"),
    };

    return EnumHandler<GeomBasisCurves::Wrap>("wrap", tok, enums);
  };

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, curves, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "curveVertexCounts", GeomBasisCurves,
                         curves->curveVertexCounts)
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomBasisCurves, curves->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", GeomBasisCurves,
                          curves->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomBasisCurves,
                  curves->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", GeomBasisCurves,
                 curves->accelerations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "widths", GeomBasisCurves, curves->widths)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "type", GeomBasisCurves::Type, TypeHandler, GeomBasisCurves,
                       curves->type, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "basis", GeomBasisCurves::Basis, BasisHandler, GeomBasisCurves,
                       curves->basis, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "wrap", GeomBasisCurves::Wrap, WrapHandler, GeomBasisCurves,
                       curves->wrap, options.strict_allowedToken_check)

    ADD_PROPERTY(table, prop, GeomBasisCurves, curves->props)

    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}